

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_color.c
# Opt level: O0

void rgb2yuv(double (*cmrgb) [3],uchar (*cmyuv) [3])

{
  double dVar1;
  double dVar2;
  long in_RSI;
  long in_RDI;
  double wb;
  double wr;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double v;
  double u;
  double y;
  double B;
  double G;
  double R;
  int i;
  double wg;
  double vmax;
  double umax;
  
  for (y._4_4_ = 0; y._4_4_ < 0x100; y._4_4_ = y._4_4_ + 1) {
    dVar1 = *(double *)(in_RDI + (long)y._4_4_ * 0x18);
    dVar2 = *(double *)(in_RDI + (long)y._4_4_ * 0x18 + 0x10);
    local_80 = dVar1 * 0.299 + *(double *)(in_RDI + (long)y._4_4_ * 0x18 + 8) * 0.5870000000000001 +
               dVar2 * 0.114;
    local_90 = (dVar2 - local_80) * 0.49209932279909707;
    local_a0 = (dVar1 - local_80) * 0.8773181169757488;
    if (local_80 <= 1.0) {
      if (local_80 < 0.0) {
        local_80 = 0.0;
      }
      local_78 = local_80;
    }
    else {
      local_78 = 1.0;
    }
    if (local_90 <= 0.436) {
      if (local_90 < -0.436) {
        local_90 = -0.436;
      }
      local_88 = local_90;
    }
    else {
      local_88 = 0.436;
    }
    if (local_a0 <= 0.615) {
      if (local_a0 < -0.615) {
        local_a0 = -0.615;
      }
      local_98 = local_a0;
    }
    else {
      local_98 = 0.615;
    }
    *(char *)(in_RSI + (long)y._4_4_ * 3) = (char)(int)(local_78 * 255.0 + 0.5);
    *(char *)(in_RSI + 1 + (long)y._4_4_ * 3) =
         (char)(int)((local_88 + 0.436) * 292.43119266055044 + 0.5);
    *(char *)(in_RSI + (long)y._4_4_ * 3 + 2) =
         (char)(int)((local_98 + 0.615) * 207.3170731707317 + 0.5);
  }
  return;
}

Assistant:

static void rgb2yuv(const double (*cmrgb)[3], unsigned char (*cmyuv)[3]) {
    const double wr = 0.299, wb = 0.114, umax = 0.436, vmax = 0.615;
    const double wg = 1 - wr - wb;

    for (int i = 0; i < 256; ++i) {
        double R = cmrgb[i][0], G = cmrgb[i][1], B = cmrgb[i][2];
        double y = wr * R + wg * G + wb * B;
        double u = (umax / (1 - wb)) * (B - y);
        double v = (vmax / (1 - wr)) * (R - y);

        y = CLAMP(y, 0, 1);
        u = CLAMP(u, -umax, umax);
        v = CLAMP(v, -vmax, vmax);

        cmyuv[i][0] = 255 * y + .5;
        cmyuv[i][1] = (255 / umax / 2) * (u + umax) + .5;
        cmyuv[i][2] = (255 / vmax / 2) * (v + vmax) + .5;
    }
}